

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * parse_value(cJSON *item,char *value,char **ep)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  char cVar7;
  double dVar8;
  double dVar9;
  
  if (value == (char *)0x0) {
    return (char *)0x0;
  }
  iVar2 = strncmp(value,"null",4);
  if (iVar2 == 0) {
    item->type = 4;
LAB_00106f1b:
    return value + 4;
  }
  iVar2 = strncmp(value,"false",5);
  if (iVar2 == 0) {
    item->type = 1;
    return value + 5;
  }
  iVar2 = strncmp(value,"true",4);
  if (iVar2 == 0) {
    item->type = 2;
    item->valueint = 1;
    goto LAB_00106f1b;
  }
  cVar1 = *value;
  if (cVar1 != '-') {
    if (cVar1 == '\"') {
      pcVar3 = parse_string(item,value,ep);
      return pcVar3;
    }
    if (9 < (byte)(cVar1 - 0x30U)) {
      if (cVar1 == '{') {
        pcVar3 = parse_object(item,value,ep);
        return pcVar3;
      }
      if (cVar1 != '[') {
        *ep = value;
        return (char *)0x0;
      }
      pcVar3 = parse_array(item,value,ep);
      return pcVar3;
    }
  }
  uVar5 = (ulong)(cVar1 == '-');
  pcVar3 = value + (value[uVar5] == '0') + uVar5;
  bVar4 = value[(value[uVar5] == '0') + uVar5];
  dVar8 = 0.0;
  dVar9 = 0.0;
  if ((byte)(bVar4 - 0x31) < 9) {
    do {
      dVar9 = dVar9 * 10.0 + (double)(int)(bVar4 - 0x30);
      bVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while ((byte)(bVar4 - 0x30) < 10);
  }
  if (bVar4 == 0x2e) {
    bVar4 = pcVar3[1];
    if (9 < (byte)(bVar4 - 0x30)) {
      iVar6 = 1;
      iVar2 = 0;
      dVar8 = 0.0;
      goto LAB_00107077;
    }
    pcVar3 = pcVar3 + 1;
    dVar8 = 0.0;
    do {
      dVar9 = dVar9 * 10.0 + (double)(int)(bVar4 - 0x30);
      dVar8 = dVar8 + -1.0;
      bVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while ((byte)(bVar4 - 0x30) < 10);
  }
  iVar2 = 0;
  if ((bVar4 | 0x20) == 0x65) {
    if (pcVar3[1] == '-') {
      pcVar3 = pcVar3 + 2;
      iVar6 = -1;
    }
    else {
      iVar6 = 1;
      if (pcVar3[1] == '+') {
        pcVar3 = pcVar3 + 2;
      }
      else {
        pcVar3 = pcVar3 + 1;
      }
    }
    cVar7 = *pcVar3;
    iVar2 = 0;
    if ((byte)(cVar7 - 0x30U) < 10) {
      iVar2 = 0;
      do {
        iVar2 = (uint)(byte)(cVar7 - 0x30) + iVar2 * 10;
        cVar7 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while ((byte)(cVar7 - 0x30U) < 10);
    }
  }
  else {
    iVar6 = 1;
  }
LAB_00107077:
  if (cVar1 == '-') {
    dVar9 = -dVar9;
  }
  dVar8 = pow(10.0,dVar8 + (double)(iVar6 * iVar2));
  item->valuedouble = dVar8 * dVar9;
  item->valueint = (int)(dVar8 * dVar9);
  item->type = 8;
  return pcVar3;
}

Assistant:

static const char *parse_value(cJSON *item,const char *value,const char **ep)
{
	if (!value)						return 0;	/* Fail on null. */
	if (!strncmp(value,"null",4))	{ item->type=cJSON_NULL;  return value+4; }
	if (!strncmp(value,"false",5))	{ item->type=cJSON_False; return value+5; }
	if (!strncmp(value,"true",4))	{ item->type=cJSON_True; item->valueint=1;	return value+4; }
	if (*value=='\"')				{ return parse_string(item,value,ep); }
	if (*value=='-' || (*value>='0' && *value<='9'))	{ return parse_number(item,value); }
	if (*value=='[')				{ return parse_array(item,value,ep); }
	if (*value=='{')				{ return parse_object(item,value,ep); }

	*ep=value;return 0;	/* failure. */
}